

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_inttable_compact(upb_inttable *t,upb_Arena *a)

{
  long lVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  uintptr_t uVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  upb_value val;
  uintptr_t key;
  upb_value val_1;
  upb_inttable new_t;
  uint32_t counts [17];
  uintptr_t max [17];
  upb_value local_150;
  uintptr_t local_148;
  upb_value local_140;
  ulong local_138;
  upb_inttable local_130;
  int local_108 [20];
  ulong local_b8 [17];
  
  local_108[0xc] = 0;
  local_108[0xd] = 0;
  local_108[0xe] = 0;
  local_108[0xf] = 0;
  local_108[8] = 0;
  local_108[9] = 0;
  local_108[10] = 0;
  local_108[0xb] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[0x10] = 0;
  memset(local_b8,0,0x88);
  local_130.t.entries = (upb_tabent *)0xffffffffffffffff;
  _Var2 = upb_inttable_next(t,&local_148,&local_150,(intptr_t *)&local_130);
  if (_Var2) {
    do {
      iVar7 = 0;
      if (local_148 == 0) {
        bVar10 = false;
      }
      else {
        bVar10 = (local_148 & local_148 - 1) != 0;
        if (local_148 != 1) {
          lVar1 = 0x3f;
          if (local_148 != 0) {
            for (; local_148 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          iVar7 = (int)lVar1;
        }
      }
      uVar8 = (ulong)((uint)bVar10 + iVar7);
      if (0xf < (uint)bVar10 + iVar7) {
        uVar8 = 0x10;
      }
      uVar5 = local_148;
      if (local_148 < local_b8[uVar8]) {
        uVar5 = local_b8[uVar8];
      }
      local_b8[uVar8] = uVar5;
      local_108[uVar8] = local_108[uVar8] + 1;
      _Var2 = upb_inttable_next(t,&local_148,&local_150,(intptr_t *)&local_130);
    } while (_Var2);
  }
  uVar9 = t->array_count + (t->t).count;
  uVar8 = 0x10;
  uVar4 = uVar9;
  do {
    if (local_108[uVar8] != 0) {
      if ((double)(1 << ((byte)uVar8 & 0x1f)) * 0.1 <= (double)uVar4) goto LAB_00289dd9;
      uVar4 = uVar4 - local_108[uVar8];
    }
    bVar10 = 1 < uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar10);
  uVar8 = 0;
LAB_00289dd9:
  if (uVar9 < uVar4) {
    __assert_fail("arr_count <= upb_inttable_count(t)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                  ,0x335,"_Bool upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  uVar8 = local_b8[(int)uVar8];
  bVar10 = false;
  iVar7 = 0;
  if (uVar9 - uVar4 != 0) {
    sVar6 = _upb_entries_needed_for((ulong)(uVar9 - uVar4));
    iVar7 = 0;
    if (sVar6 == 0) {
      bVar10 = false;
    }
    else {
      bVar10 = (sVar6 & sVar6 - 1) != 0;
      if (sVar6 != 1) {
        lVar1 = 0x3f;
        if (sVar6 != 0) {
          for (; sVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        iVar7 = (int)lVar1;
      }
    }
  }
  uVar4 = 0x10;
  if ((uint)bVar10 + iVar7 < 0x10) {
    uVar4 = (uint)bVar10 + iVar7;
  }
  _Var2 = upb_inttable_sizedinit(&local_130,(uint32_t)(uVar8 + 1),uVar4,a);
  if (_Var2) {
    local_148 = 0xffffffffffffffff;
    local_138 = uVar8 + 1;
    _Var3 = upb_inttable_next(t,&local_150.val,&local_140,(intptr_t *)&local_148);
    if (_Var3) {
      do {
        upb_inttable_insert(&local_130,local_150.val,local_140,a);
        _Var3 = upb_inttable_next(t,&local_150.val,&local_140,(intptr_t *)&local_148);
      } while (_Var3);
    }
    if (local_138 != local_130.array_size) {
      __assert_fail("new_t.array_size == arr_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x34c,"_Bool upb_inttable_compact(upb_inttable *, upb_Arena *)");
    }
    t->array_size = local_130.array_size;
    t->array_count = local_130.array_count;
    t->array = local_130.array;
    t->presence_mask = local_130.presence_mask;
    (t->t).entries = local_130.t.entries;
    (t->t).count = local_130.t.count;
    (t->t).mask = local_130.t.mask;
  }
  return _Var2;
}

Assistant:

bool upb_inttable_compact(upb_inttable* t, upb_Arena* a) {
  /* A power-of-two histogram of the table keys. */
  uint32_t counts[UPB_MAXARRSIZE + 1] = {0};

  /* The max key in each bucket. */
  uintptr_t max[UPB_MAXARRSIZE + 1] = {0};

  {
    intptr_t iter = UPB_INTTABLE_BEGIN;
    uintptr_t key;
    upb_value val;
    while (upb_inttable_next(t, &key, &val, &iter)) {
      int bucket = log2ceil(key);
      max[bucket] = UPB_MAX(max[bucket], key);
      counts[bucket]++;
    }
  }

  /* Find the largest power of two that satisfies the MIN_DENSITY
   * definition (while actually having some keys). */
  uint32_t arr_count = upb_inttable_count(t);

  // Scan all buckets except capped bucket
  int size_lg2 = ARRAY_SIZE(counts) - 1;
  for (; size_lg2 > 0; size_lg2--) {
    if (counts[size_lg2] == 0) {
      /* We can halve again without losing any entries. */
      continue;
    } else if (arr_count >= (1 << size_lg2) * MIN_DENSITY) {
      break;
    }

    arr_count -= counts[size_lg2];
  }

  UPB_ASSERT(arr_count <= upb_inttable_count(t));

  upb_inttable new_t;
  {
    /* Insert all elements into new, perfectly-sized table. */
    uintptr_t arr_size = max[size_lg2] + 1; /* +1 so arr[max] will fit. */
    uint32_t hash_count = upb_inttable_count(t) - arr_count;
    size_t hash_size = hash_count ? _upb_entries_needed_for(hash_count) : 0;
    int hashsize_lg2 = log2ceil(hash_size);

    if (!upb_inttable_sizedinit(&new_t, arr_size, hashsize_lg2, a)) {
      return false;
    }

    {
      intptr_t iter = UPB_INTTABLE_BEGIN;
      uintptr_t key;
      upb_value val;
      while (upb_inttable_next(t, &key, &val, &iter)) {
        upb_inttable_insert(&new_t, key, val, a);
      }
    }

    UPB_ASSERT(new_t.array_size == arr_size);
  }
  *t = new_t;
  return true;
}